

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  long lVar5;
  long lVar6;
  PrimRefMB *pPVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  uint uVar17;
  ulong uVar19;
  size_t itime;
  ulong uVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar47;
  undefined1 auVar46 [16];
  float fVar53;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar66;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar67;
  undefined1 auVar68 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar69;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar70;
  undefined1 auVar71 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar72;
  undefined1 auVar73 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar74;
  undefined1 auVar75 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  ulong local_220;
  size_t local_218;
  unsigned_long local_1f8;
  size_t local_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  ulong local_190;
  anon_class_16_2_07cfa4d6 local_188;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_178;
  undefined1 local_168 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  float local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined1 local_108 [16];
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar18;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar23 = r->_begin;
  uVar19 = r->_end;
  if (uVar23 < uVar19) {
    auVar60 = ZEXT464(0x3f800000);
    local_118 = 1.0;
    uStack_114 = 0;
    uStack_110 = 0;
    uStack_10c = 0;
    auVar26 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
    auVar76 = ZEXT1664(auVar26);
    auVar27._8_4_ = 0xff800000;
    auVar27._0_8_ = 0xff800000ff800000;
    auVar27._12_4_ = 0xff800000;
    auVar64 = ZEXT1664(auVar27);
    auVar28._8_4_ = 0x7f800000;
    auVar28._0_8_ = 0x7f8000007f800000;
    auVar28._12_4_ = 0x7f800000;
    auVar65 = ZEXT1664(auVar28);
    local_1f8 = 0;
    auVar26 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
    auVar77 = ZEXT1664(auVar26);
    auVar26 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
    auVar78 = ZEXT1664(auVar26);
    auVar75 = ZEXT1664(auVar28);
    auVar73 = ZEXT1664(auVar27);
    auVar68 = ZEXT1664(auVar28);
    auVar71 = ZEXT1664(auVar27);
    local_1f0 = 0;
    local_220 = 0;
    local_f8 = 0.0;
    uStack_f4 = 0;
    uStack_f0 = 0;
    uStack_ec = 0;
    local_218 = k;
    do {
      BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry
              .super_Geometry.time_range;
      auVar26._8_8_ = 0;
      auVar26._0_4_ = BVar2.lower;
      auVar26._4_4_ = BVar2.upper;
      auVar26 = vmovshdup_avx(auVar26);
      fVar30 = BVar2.lower;
      fVar31 = auVar26._0_4_ - fVar30;
      auVar29._0_4_ = (t0t1->lower - fVar30) / fVar31;
      auVar29._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar26 = vmulss_avx512f(auVar29,SUB6416(ZEXT464(0x3f800002),0));
      auVar27 = vmulss_avx512f(ZEXT416((uint)((t0t1->upper - fVar30) / fVar31)),
                               SUB6416(ZEXT464(0x3f7ffffc),0));
      uVar17 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>
                                   ).super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>)
                                  .super_CurveGeometry.field_0x68 * uVar23);
      uVar18 = (ulong)(uVar17 + 1);
      pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
               super_CurveGeometry.vertices.items;
      if (uVar18 < (pBVar3->super_RawBufferView).num) {
        fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.fnumTimeSegments;
        auVar26 = ZEXT416((uint)(fVar1 * auVar26._0_4_));
        auVar26 = vroundss_avx(auVar26,auVar26,9);
        auVar28 = vmaxss_avx512f(auVar76._0_16_,auVar26);
        auVar26 = ZEXT416((uint)(fVar1 * auVar27._0_4_));
        auVar26 = vroundss_avx(auVar26,auVar26,10);
        auVar26 = vminss_avx(auVar26,ZEXT416((uint)fVar1));
        if ((uint)(int)auVar28._0_4_ <= (uint)(int)auVar26._0_4_) {
          uVar20 = (ulong)(int)auVar28._0_4_;
          pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.tangents.items;
          lVar21 = uVar20 * 0x38 + 0x10;
          do {
            lVar5 = *(long *)((long)pBVar3 + lVar21 + -0x10);
            lVar6 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar21);
            auVar27 = *(undefined1 (*) [16])(lVar5 + lVar6 * (ulong)uVar17);
            auVar28 = auVar77._0_16_;
            uVar15 = vcmpps_avx512vl(auVar27,auVar28,6);
            auVar29 = auVar78._0_16_;
            uVar16 = vcmpps_avx512vl(auVar27,auVar29,1);
            if ((byte)((byte)uVar15 & (byte)uVar16) != 0xf) goto LAB_01ef0665;
            auVar27 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar18);
            uVar15 = vcmpps_avx512vl(auVar27,auVar28,6);
            uVar16 = vcmpps_avx512vl(auVar27,auVar29,1);
            if ((byte)((byte)uVar15 & (byte)uVar16) != 0xf) goto LAB_01ef0665;
            lVar5 = *(long *)((long)pBVar4 + lVar21 + -0x10);
            lVar6 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar21);
            auVar27 = *(undefined1 (*) [16])(lVar5 + lVar6 * (ulong)uVar17);
            uVar15 = vcmpps_avx512vl(auVar27,auVar28,6);
            uVar16 = vcmpps_avx512vl(auVar27,auVar29,1);
            if ((byte)((byte)uVar15 & (byte)uVar16) != 0xf) goto LAB_01ef0665;
            auVar27 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar18);
            uVar15 = vcmpps_avx512vl(auVar27,auVar28,6);
            uVar16 = vcmpps_avx512vl(auVar27,auVar29,1);
            if ((byte)((byte)uVar15 & (byte)uVar16) != 0xf) goto LAB_01ef0665;
            uVar20 = uVar20 + 1;
            lVar21 = lVar21 + 0x38;
          } while (uVar20 <= (ulong)(long)(int)auVar26._0_4_);
        }
        local_138 = auVar75._0_16_;
        local_128 = auVar73._0_16_;
        local_108 = auVar71._0_16_;
        local_e8 = auVar68._0_16_;
        local_d8 = auVar65._0_16_;
        local_c8 = auVar64._0_16_;
        local_b8 = auVar60._0_16_;
        local_188.primID = &local_190;
        fVar37 = (t0t1->lower - fVar30) / fVar31;
        fVar31 = (t0t1->upper - fVar30) / fVar31;
        fVar30 = fVar1 * fVar37;
        fVar33 = fVar1 * fVar31;
        auVar27 = vroundss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30),9);
        auVar28 = vroundss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33),10);
        auVar29 = vmaxss_avx512f(auVar27,auVar76._0_16_);
        auVar26 = vminss_avx(auVar28,ZEXT416((uint)fVar1));
        iVar22 = (int)auVar29._0_4_;
        fVar42 = auVar26._0_4_;
        uVar17 = (int)auVar27._0_4_;
        if ((int)auVar27._0_4_ < 0) {
          uVar17 = 0xffffffff;
        }
        iVar24 = (int)fVar1 + 1;
        if ((int)auVar28._0_4_ < (int)fVar1 + 1) {
          iVar24 = (int)auVar28._0_4_;
        }
        local_190 = uVar23;
        local_188.this = this;
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_158.field_1,&local_188,(long)iVar22);
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_178.field_1,&local_188,(long)(int)fVar42);
        fVar30 = fVar30 - auVar29._0_4_;
        if (iVar24 - uVar17 == 1) {
          auVar26 = vmaxss_avx(ZEXT416((uint)fVar30),ZEXT816(0) << 0x40);
          fVar30 = auVar26._0_4_;
          fVar31 = 1.0 - fVar30;
          auVar56._0_4_ = fVar30 * local_178.m128[0];
          auVar56._4_4_ = fVar30 * local_178.m128[1];
          auVar56._8_4_ = fVar30 * local_178.m128[2];
          auVar56._12_4_ = fVar30 * local_178.m128[3];
          auVar38._4_4_ = fVar31;
          auVar38._0_4_ = fVar31;
          auVar38._8_4_ = fVar31;
          auVar38._12_4_ = fVar31;
          auVar58 = vfmadd231ps_fma(auVar56,auVar38,(undefined1  [16])local_158);
          auVar61._0_4_ = fVar30 * local_168._0_4_;
          auVar61._4_4_ = fVar30 * local_168._4_4_;
          auVar61._8_4_ = fVar30 * local_168._8_4_;
          auVar61._12_4_ = fVar30 * local_168._12_4_;
          auVar63 = vfmadd231ps_fma(auVar61,local_148,auVar38);
          auVar26 = vmaxss_avx(ZEXT416((uint)(fVar42 - fVar33)),ZEXT816(0) << 0x40);
          fVar30 = auVar26._0_4_;
          fVar31 = 1.0 - fVar30;
          auVar44._0_4_ = fVar30 * local_158.m128[0];
          auVar44._4_4_ = fVar30 * local_158.m128[1];
          auVar44._8_4_ = fVar30 * local_158.m128[2];
          auVar44._12_4_ = fVar30 * local_158.m128[3];
          auVar39._4_4_ = fVar31;
          auVar39._0_4_ = fVar31;
          auVar39._8_4_ = fVar31;
          auVar39._12_4_ = fVar31;
          auVar46 = vfmadd231ps_fma(auVar44,auVar39,(undefined1  [16])local_178);
          auVar48._0_4_ = fVar30 * local_148._0_4_;
          auVar48._4_4_ = fVar30 * local_148._4_4_;
          auVar48._8_4_ = fVar30 * local_148._8_4_;
          auVar48._12_4_ = fVar30 * local_148._12_4_;
          auVar50 = vfmadd231ps_fma(auVar48,auVar39,local_168);
          auVar26 = vxorps_avx512vl(auVar76._0_16_,auVar76._0_16_);
        }
        else {
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_58.field_1,&local_188,(long)(iVar22 + 1));
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_78.field_1,&local_188,(long)((int)fVar42 + -1));
          auVar27 = auVar76._0_16_;
          auVar26 = vmaxss_avx(ZEXT416((uint)fVar30),ZEXT816(0) << 0x40);
          fVar32 = auVar26._0_4_;
          auVar57._0_4_ = fVar32 * local_58.m128[0];
          auVar57._4_4_ = fVar32 * local_58.m128[1];
          auVar57._8_4_ = fVar32 * local_58.m128[2];
          auVar57._12_4_ = fVar32 * local_58.m128[3];
          fVar30 = 1.0 - fVar32;
          auVar34._4_4_ = fVar30;
          auVar34._0_4_ = fVar30;
          auVar34._8_4_ = fVar30;
          auVar34._12_4_ = fVar30;
          auVar58 = vfmadd231ps_fma(auVar57,auVar34,(undefined1  [16])local_158);
          auVar62._0_4_ = fVar32 * local_48;
          auVar62._4_4_ = fVar32 * fStack_44;
          auVar62._8_4_ = fVar32 * fStack_40;
          auVar62._12_4_ = fVar32 * fStack_3c;
          auVar63 = vfmadd231ps_fma(auVar62,auVar34,local_148);
          auVar26 = vmaxss_avx(ZEXT416((uint)(fVar42 - fVar33)),ZEXT816(0) << 0x40);
          fVar33 = auVar26._0_4_;
          fVar30 = 1.0 - fVar33;
          auVar45._0_4_ = fVar33 * local_78.m128[0];
          auVar45._4_4_ = fVar33 * local_78.m128[1];
          auVar45._8_4_ = fVar33 * local_78.m128[2];
          auVar45._12_4_ = fVar33 * local_78.m128[3];
          auVar40._4_4_ = fVar30;
          auVar40._0_4_ = fVar30;
          auVar40._8_4_ = fVar30;
          auVar40._12_4_ = fVar30;
          auVar46 = vfmadd231ps_fma(auVar45,auVar40,(undefined1  [16])local_178);
          auVar49._0_4_ = fVar33 * local_68;
          auVar49._4_4_ = fVar33 * fStack_64;
          auVar49._8_4_ = fVar33 * fStack_60;
          auVar49._12_4_ = fVar33 * fStack_5c;
          auVar50 = vfmadd231ps_fma(auVar49,auVar40,local_168);
          if ((int)(uVar17 + 1) < iVar24) {
            itime = (size_t)(uVar17 + 1);
            iVar24 = ~uVar17 + iVar24;
            do {
              fVar33 = ((float)(int)itime / fVar1 - fVar37) / (fVar31 - fVar37);
              fVar30 = 1.0 - fVar33;
              auVar43._0_4_ = auVar46._0_4_ * fVar33;
              fVar42 = auVar46._4_4_;
              auVar43._4_4_ = fVar42 * fVar33;
              fVar32 = auVar46._8_4_;
              auVar43._8_4_ = fVar32 * fVar33;
              fVar47 = auVar46._12_4_;
              auVar43._12_4_ = fVar47 * fVar33;
              auVar41._4_4_ = fVar30;
              auVar41._0_4_ = fVar30;
              auVar41._8_4_ = fVar30;
              auVar41._12_4_ = fVar30;
              auVar26 = vfmadd231ps_fma(auVar43,auVar41,auVar58);
              auVar35._0_4_ = auVar50._0_4_ * fVar33;
              fVar30 = auVar50._4_4_;
              auVar35._4_4_ = fVar30 * fVar33;
              fVar53 = auVar50._8_4_;
              auVar35._8_4_ = fVar53 * fVar33;
              fVar54 = auVar50._12_4_;
              auVar35._12_4_ = fVar54 * fVar33;
              local_a8 = vfmadd231ps_fma(auVar35,auVar63,auVar41);
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_188,itime);
              auVar27 = auVar76._0_16_;
              local_1e8 = auVar63._0_4_;
              fStack_1e4 = auVar63._4_4_;
              fStack_1e0 = auVar63._8_4_;
              fStack_1dc = auVar63._12_4_;
              local_1d8 = auVar58._0_4_;
              fStack_1d4 = auVar58._4_4_;
              fStack_1d0 = auVar58._8_4_;
              fStack_1cc = auVar58._12_4_;
              auVar26 = vsubps_avx((undefined1  [16])local_98,auVar26);
              auVar29 = vsubps_avx(local_88,local_a8);
              auVar28 = vminps_avx(auVar26,ZEXT816(0) << 0x40);
              auVar26 = vmaxps_avx(auVar29,ZEXT816(0) << 0x40);
              auVar58._0_4_ = local_1d8 + auVar28._0_4_;
              auVar58._4_4_ = fStack_1d4 + auVar28._4_4_;
              auVar58._8_4_ = fStack_1d0 + auVar28._8_4_;
              auVar58._12_4_ = fStack_1cc + auVar28._12_4_;
              auVar46._0_4_ = auVar46._0_4_ + auVar28._0_4_;
              auVar46._4_4_ = fVar42 + auVar28._4_4_;
              auVar46._8_4_ = fVar32 + auVar28._8_4_;
              auVar46._12_4_ = fVar47 + auVar28._12_4_;
              auVar63._0_4_ = local_1e8 + auVar26._0_4_;
              auVar63._4_4_ = fStack_1e4 + auVar26._4_4_;
              auVar63._8_4_ = fStack_1e0 + auVar26._8_4_;
              auVar63._12_4_ = fStack_1dc + auVar26._12_4_;
              auVar50._0_4_ = auVar50._0_4_ + auVar26._0_4_;
              auVar50._4_4_ = fVar30 + auVar26._4_4_;
              auVar50._8_4_ = fVar53 + auVar26._8_4_;
              auVar50._12_4_ = fVar54 + auVar26._12_4_;
              itime = itime + 1;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          auVar26 = vxorps_avx512vl(auVar27,auVar27);
        }
        auVar76 = ZEXT1664(auVar26);
        aVar11 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar58,ZEXT416(geomID),0x30);
        uVar17 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.numTimeSteps - 1;
        uVar18 = (ulong)uVar17;
        BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.time_range;
        auVar36._8_8_ = 0;
        auVar36._0_4_ = BVar2.lower;
        auVar36._4_4_ = BVar2.upper;
        aVar12 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                 vinsertps_avx(auVar63,ZEXT416((uint)uVar23),0x30);
        aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar46,ZEXT416(uVar17),0x30);
        aVar14 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar50,ZEXT416(uVar17),0x30);
        auVar59._8_4_ = 0x3f000000;
        auVar59._0_8_ = 0x3f0000003f000000;
        auVar59._12_4_ = 0x3f000000;
        auVar51._0_4_ = aVar13.x * 0.5;
        auVar51._4_4_ = aVar13.y * 0.5;
        auVar51._8_4_ = aVar13.z * 0.5;
        auVar51._12_4_ = aVar13.field_3.w * 0.5;
        auVar26 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar11,auVar59);
        auVar55._0_4_ = aVar14.x * 0.5;
        auVar55._4_4_ = aVar14.y * 0.5;
        auVar55._8_4_ = aVar14.z * 0.5;
        auVar55._12_4_ = aVar14.field_3.w * 0.5;
        auVar27 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar12,auVar59);
        auVar52._0_4_ = auVar26._0_4_ + auVar27._0_4_;
        auVar52._4_4_ = auVar26._4_4_ + auVar27._4_4_;
        auVar52._8_4_ = auVar26._8_4_ + auVar27._8_4_;
        auVar52._12_4_ = auVar26._12_4_ + auVar27._12_4_;
        auVar26 = vminps_avx(local_d8,(undefined1  [16])aVar11);
        auVar65 = ZEXT1664(auVar26);
        auVar26 = vmaxps_avx(local_c8,(undefined1  [16])aVar12);
        auVar64 = ZEXT1664(auVar26);
        auVar26 = vminps_avx(local_138,(undefined1  [16])aVar13);
        auVar75 = ZEXT1664(auVar26);
        auVar26 = vmaxps_avx(local_128,(undefined1  [16])aVar14);
        auVar73 = ZEXT1664(auVar26);
        auVar26 = vminps_avx(local_e8,auVar52);
        auVar68 = ZEXT1664(auVar26);
        auVar26 = vmaxps_avx(local_108,auVar52);
        auVar71 = ZEXT1664(auVar26);
        uVar19 = vcmpps_avx512vl(local_b8,auVar36,1);
        auVar27 = vinsertps_avx(local_b8,auVar36,0x50);
        auVar26 = vblendps_avx(auVar36,local_b8,2);
        bVar25 = (bool)((byte)uVar19 & 1);
        bVar8 = (bool)((byte)(uVar19 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar19 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar60 = ZEXT1664(CONCAT412((uint)bVar10 * auVar27._12_4_ | (uint)!bVar10 * auVar26._12_4_,
                                     CONCAT48((uint)bVar9 * auVar27._8_4_ |
                                              (uint)!bVar9 * auVar26._8_4_,
                                              CONCAT44((uint)bVar8 * auVar27._4_4_ |
                                                       (uint)!bVar8 * auVar26._4_4_,
                                                       (uint)bVar25 * auVar27._0_4_ |
                                                       (uint)!bVar25 * auVar26._0_4_))));
        local_1f8 = local_1f8 + 1;
        local_1f0 = local_1f0 + uVar18;
        bVar25 = local_220 < uVar18;
        auVar26 = vmovshdup_avx(auVar36);
        local_118 = (float)((uint)bVar25 * auVar26._0_4_ + (uint)!bVar25 * (int)local_118);
        local_f8 = (float)((uint)bVar25 * (int)BVar2.lower + (uint)!bVar25 * (int)local_f8);
        if (local_220 <= uVar18) {
          local_220 = uVar18;
        }
        pPVar7 = prims->items;
        pPVar7[local_218].lbounds.bounds0.lower.field_0 = aVar11;
        pPVar7[local_218].lbounds.bounds0.upper.field_0 = aVar12;
        pPVar7[local_218].lbounds.bounds1.lower.field_0.field_1 = aVar13;
        pPVar7[local_218].lbounds.bounds1.upper.field_0.field_1 = aVar14;
        pPVar7[local_218].time_range = BVar2;
        uVar19 = r->_end;
        auVar26 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
        auVar77 = ZEXT1664(auVar26);
        auVar26 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
        auVar78 = ZEXT1664(auVar26);
        local_218 = local_218 + 1;
      }
LAB_01ef0665:
      auVar26 = auVar60._0_16_;
      aVar69 = auVar64._0_16_;
      aVar66 = auVar65._0_16_;
      uVar23 = uVar23 + 1;
    } while (uVar23 < uVar19);
    (__return_storage_ptr__->object_range)._end = local_1f8;
    aVar74 = auVar75._0_16_;
    aVar72 = auVar73._0_16_;
    aVar67 = auVar68._0_16_;
    aVar70 = auVar71._0_16_;
  }
  else {
    auVar26 = SUB6416(ZEXT464(0x3f800000),0);
    aVar66.m128[2] = INFINITY;
    aVar66._0_8_ = 0x7f8000007f800000;
    aVar66.m128[3] = INFINITY;
    aVar69.m128[2] = -INFINITY;
    aVar69._0_8_ = 0xff800000ff800000;
    aVar69.m128[3] = -INFINITY;
    local_f8 = 0.0;
    local_118 = 1.0;
    local_220 = 0;
    local_1f0 = 0;
    aVar74 = aVar66;
    aVar72 = aVar69;
    aVar67 = aVar66;
    aVar70 = aVar69;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar66;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar69;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar74;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar72;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar67;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar70;
  BVar2 = (BBox1f)vmovlps_avx(auVar26);
  __return_storage_ptr__->time_range = BVar2;
  __return_storage_ptr__->num_time_segments = local_1f0;
  __return_storage_ptr__->max_num_time_segments = local_220;
  (__return_storage_ptr__->max_time_range).lower = local_f8;
  (__return_storage_ptr__->max_time_range).upper = local_118;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }